

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O0

void __thiscall
gl4cts::GPUShaderFP64Test2::prepareTestShader
          (GPUShaderFP64Test2 *this,GLchar *stage_specific_layout,GLchar *uniform_definitions,
          GLchar *in_variable_definitions,GLchar *out_variable_definitions,
          GLchar *uniform_verification,GLchar *stage_specific_main_body,string *out_source_code)

{
  GLchar *__s;
  size_t local_78;
  size_t search_position;
  allocator<char> local_59;
  undefined1 local_58 [8];
  string string;
  GLchar *uniform_verification_local;
  GLchar *out_variable_definitions_local;
  GLchar *in_variable_definitions_local;
  GLchar *uniform_definitions_local;
  GLchar *stage_specific_layout_local;
  GPUShaderFP64Test2 *this_local;
  
  __s = prepareTestShader::test_shader_template_code;
  string.field_2._8_8_ = uniform_verification;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_58,__s,&local_59);
  std::allocator<char>::~allocator(&local_59);
  local_78 = 0;
  Utils::replaceToken(prepareTestShader::layout_token,&local_78,stage_specific_layout,
                      (string *)local_58);
  Utils::replaceToken(prepareTestShader::uni_def_token,&local_78,uniform_definitions,
                      (string *)local_58);
  Utils::replaceToken(prepareTestShader::in_var_token,&local_78,in_variable_definitions,
                      (string *)local_58);
  Utils::replaceToken(prepareTestShader::out_var_token,&local_78,out_variable_definitions,
                      (string *)local_58);
  Utils::replaceToken(prepareTestShader::uni_ver_token,&local_78,(GLchar *)string.field_2._8_8_,
                      (string *)local_58);
  Utils::replaceToken(prepareTestShader::body_token,&local_78,stage_specific_main_body,
                      (string *)local_58);
  std::__cxx11::string::operator=((string *)out_source_code,(string *)local_58);
  std::__cxx11::string::~string((string *)local_58);
  return;
}

Assistant:

void GPUShaderFP64Test2::prepareTestShader(const glw::GLchar* stage_specific_layout,
										   const glw::GLchar* uniform_definitions,
										   const glw::GLchar* in_variable_definitions,
										   const glw::GLchar* out_variable_definitions,
										   const glw::GLchar* uniform_verification,
										   const glw::GLchar* stage_specific_main_body,
										   std::string&		  out_source_code) const
{
	/* Shader template */
	static const glw::GLchar* test_shader_template_code = "#version 400 core\n"
														  "\n"
														  "precision highp float;\n"
														  "\n"
														  "STAGE_SPECIFIC_LAYOUT"
														  "UNIFORM_DEFINITIONS"
														  "IN_VARIABLE_DEFINITION"
														  "OUT_VARIABLE_DEFINITION"
														  "\n"
														  "void main()\n"
														  "{\n"
														  "UNIFORM_VERIFICATION"
														  "STAGE_SPECIFIC_MAIN_BODY"
														  "}\n"
														  "\n";

	std::string string = test_shader_template_code;

	/* Tokens */
	static const glw::GLchar* body_token	= "STAGE_SPECIFIC_MAIN_BODY";
	static const glw::GLchar* in_var_token  = "IN_VARIABLE_DEFINITION";
	static const glw::GLchar* layout_token  = "STAGE_SPECIFIC_LAYOUT";
	static const glw::GLchar* out_var_token = "OUT_VARIABLE_DEFINITION";
	static const glw::GLchar* uni_def_token = "UNIFORM_DEFINITIONS";
	static const glw::GLchar* uni_ver_token = "UNIFORM_VERIFICATION";

	size_t search_position = 0;

	/* Replace tokens */
	Utils::replaceToken(layout_token, search_position, stage_specific_layout, string);
	Utils::replaceToken(uni_def_token, search_position, uniform_definitions, string);
	Utils::replaceToken(in_var_token, search_position, in_variable_definitions, string);
	Utils::replaceToken(out_var_token, search_position, out_variable_definitions, string);
	Utils::replaceToken(uni_ver_token, search_position, uniform_verification, string);
	Utils::replaceToken(body_token, search_position, stage_specific_main_body, string);

	/* Store resuls */
	out_source_code = string;
}